

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O2

compile_errcode __thiscall Factor::Parse(Factor *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  compile_errcode cVar2;
  char *pcVar3;
  allocator local_31;
  string str;
  
  SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
  if (SVar1 == L_CIRCLE_BRACKET_SYM) {
    SymbolQueue::NextSymbol(handle_symbol_queue);
    cVar2 = Expression::Parse(&this->m_expression);
    if (cVar2 != 0) {
      pcVar3 = "expected a valid expression in bracket";
      goto LAB_0013529b;
    }
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (SVar1 == R_CIRCLE_BRACKET_SYM) goto LAB_00135217;
  }
  else {
    if ((SVar1 == CHARACTER_SYM) || (SVar1 == INTERGER_SYM)) goto LAB_00135217;
    if (SVar1 != IDENTIFIER_SYM) {
      pcVar3 = "invalid symbol in factor parse";
      goto LAB_0013529b;
    }
    SymbolQueue::SetCacheLocate(handle_symbol_queue);
    SymbolQueue::NextSymbol(handle_symbol_queue);
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (SVar1 != L_CIRCLE_BRACKET_SYM) {
      if (SVar1 != L_SQUARE_BRACKET_SYM) {
        SymbolQueue::SetCurrentLocate(handle_symbol_queue);
LAB_00135217:
        SymbolQueue::NextSymbol(handle_symbol_queue);
        return 0;
      }
      SymbolQueue::NextSymbol(handle_symbol_queue);
      cVar2 = Expression::Parse(&this->m_expression);
      if (cVar2 == 0) {
        SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
        if (SVar1 == R_SQUARE_BRACKET_SYM) goto LAB_00135217;
        pcVar3 = "expected a \']\'";
      }
      else {
        pcVar3 = "expected a valid array index expression";
      }
      goto LAB_0013529b;
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
    cVar2 = ValueArgumentList::Parse(&this->m_value_argument_list);
    if (cVar2 != 0) {
      pcVar3 = "expected a valid value argument list";
      goto LAB_0013529b;
    }
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (SVar1 == R_CIRCLE_BRACKET_SYM) {
      std::__cxx11::string::string((string *)&str,"This is a function call",&local_31);
      LogTools::GrammaNormalLogs(g_log_tools,&str);
      std::__cxx11::string::~string((string *)&str);
      goto LAB_00135217;
    }
  }
  pcVar3 = "expected a \')\'";
LAB_0013529b:
  log_tools_ptr = g_log_tools;
  std::__cxx11::string::string((string *)&str,pcVar3,&local_31);
  GrammaErrorLogs(log_tools_ptr,&str);
  std::__cxx11::string::~string((string *)&str);
  return -1;
}

Assistant:

compile_errcode Factor::Parse() {
    int ret = COMPILE_OK;
    SymbolName name = handle_symbol_queue->GetCurrentName();
    switch (name) {
        case INTERGER_SYM: break;
        case CHARACTER_SYM: break;
        case IDENTIFIER_SYM: {
            handle_symbol_queue->SetCacheLocate();
            handle_symbol_queue->NextSymbol();
            name = handle_symbol_queue->GetCurrentName();
            if (name == L_SQUARE_BRACKET_SYM) {
                handle_symbol_queue->NextSymbol();
                if ((ret = m_expression.Parse()) == COMPILE_OK) {
                    // m_expression.LogOutput();
                    name = handle_symbol_queue->GetCurrentName();
                    if (name == R_SQUARE_BRACKET_SYM) {
                        break;
                    } else {
                        GrammaErrorLogs(g_log_tools, "expected a ']'");
                        return NOT_MATCH;
                    }
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid array index expression");
                    return NOT_MATCH;
                }
            } else if (name == L_CIRCLE_BRACKET_SYM) {
                handle_symbol_queue->NextSymbol();
                if ((ret = m_value_argument_list.Parse()) == COMPILE_OK) {
                    // m_value_argument_list.LogOutput();
                    name = handle_symbol_queue->GetCurrentName();
                    if (name == R_CIRCLE_BRACKET_SYM) {
                        string str = "This is a function call";
                        g_log_tools->GrammaNormalLogs(str);
                        break;
                    } else {
                        GrammaErrorLogs(g_log_tools, "expected a ')'");
                        return NOT_MATCH;
                    }
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid value argument list");
                    return NOT_MATCH;
                }
            } else {
                handle_symbol_queue->SetCurrentLocate();
                break;
            }
        }
        case L_CIRCLE_BRACKET_SYM: {
            handle_symbol_queue->NextSymbol();
            if ((ret = m_expression.Parse()) == COMPILE_OK) {
                // m_expression.LogOutput();
                name = handle_symbol_queue->GetCurrentName();
                if (name == R_CIRCLE_BRACKET_SYM) {
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')'");
                    return NOT_MATCH;
                }
            } else {
                GrammaErrorLogs(g_log_tools, "expected a valid expression in bracket");
                return NOT_MATCH;
            }
        }
        default: {
            GrammaErrorLogs(g_log_tools, "invalid symbol in factor parse");
            return NOT_MATCH;
        }
    }
    handle_symbol_queue->NextSymbol();
    return COMPILE_OK;
}